

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

vec3 polyscope::view::bufferCoordsToWorldRay(vec2 screenCoords)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  undefined8 in_XMM0_Qb;
  undefined8 uVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar7;
  vec<3,_float,_(glm::qualifier)0> vVar8;
  vec3 vVar9;
  vec3 screenPos3;
  mat4 view;
  mat4 proj;
  mat4 invViewMat;
  undefined1 local_158 [16];
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_134;
  float local_130;
  undefined4 local_12c;
  vec<4,_float,_(glm::qualifier)0> local_128;
  mat<4,_4,_float,_(glm::qualifier)0> local_118;
  mat<4,_4,_float,_(glm::qualifier)0> local_d8;
  mat<4,_4,_float,_(glm::qualifier)0> local_98;
  ulong local_28;
  float local_20;
  
  local_158._8_8_ = in_XMM0_Qb;
  local_158._0_8_ = screenCoords;
  local_118.value[0]._0_8_ = _viewMat;
  local_118.value[0]._8_8_ = DAT_006006ac;
  local_118.value[1]._0_8_ = DAT_006006b4;
  local_118.value[1]._8_8_ = _DAT_006006bc;
  local_118.value[2]._0_8_ = DAT_006006c4;
  local_118.value[2]._8_8_ = DAT_006006cc;
  local_118.value[3]._0_8_ = DAT_006006d4;
  local_118.value[3]._8_8_ = DAT_006006dc;
  getCameraPerspectiveMatrix();
  local_128.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_128.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_128.field_2.z = (float)bufferWidth;
  local_128.field_3.w = (float)bufferHeight;
  auVar1 = vmovshdup_avx(local_158);
  local_130 = local_128.field_3.w - auVar1._0_4_;
  uVar6 = 0;
  local_134 = screenCoords.field_0;
  local_12c = 0;
  vVar8 = glm::unProjectNO<float,float,(glm::qualifier)0>
                    ((vec<3,_float,_(glm::qualifier)0> *)&local_134,&local_118,&local_98,&local_128)
  ;
  local_d8.value[0].field_0 = viewMat;
  local_d8.value[0].field_1 = viewMat_4;
  local_d8.value[0].field_2 = DAT_006006ac._0_4_;
  local_d8.value[0].field_3 = DAT_006006ac._4_4_;
  local_d8.value[1].field_0 = DAT_006006b4._0_4_;
  local_d8.value[1].field_1 = DAT_006006b4._4_4_;
  local_d8.value[1].field_2 = DAT_006006bc;
  local_d8.value[1].field_3 = _DAT_006006c0;
  local_d8.value[2].field_0 = DAT_006006c4._0_4_;
  local_d8.value[2].field_1 = DAT_006006c4._4_4_;
  local_d8.value[2].field_2 = DAT_006006cc._0_4_;
  local_d8.value[2].field_3 = DAT_006006cc._4_4_;
  local_d8.value[3].field_0 = DAT_006006d4._0_4_;
  local_d8.value[3].field_1 = DAT_006006d4._4_4_;
  local_d8.value[3].field_2 = DAT_006006dc._0_4_;
  local_d8.value[3].field_3 = DAT_006006dc._4_4_;
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_d8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_28;
  auVar1._8_8_ = uVar6;
  auVar1._0_8_ = vVar8._0_8_;
  auVar1 = vsubps_avx(auVar1,auVar4);
  fVar2 = auVar1._0_4_;
  auVar5._0_4_ = fVar2 * fVar2;
  fVar3 = auVar1._4_4_;
  auVar5._4_4_ = fVar3 * fVar3;
  auVar5._8_4_ = auVar1._8_4_ * auVar1._8_4_;
  auVar5._12_4_ = auVar1._12_4_ * auVar1._12_4_;
  auVar1 = vhaddps_avx(auVar5,auVar5);
  local_20 = vVar8.field_2.z - local_20;
  fVar7 = auVar1._0_4_ + local_20 * local_20;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    auVar1 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar7 = auVar1._0_4_;
  }
  fVar7 = 1.0 / fVar7;
  vVar9.field_0 = fVar2 * fVar7;
  vVar9.field_1 = fVar3 * fVar7;
  vVar9.field_2.z = local_20 * fVar7;
  return vVar9;
}

Assistant:

glm::vec3 bufferCoordsToWorldRay(glm::vec2 screenCoords) {

  glm::mat4 view = getCameraViewMatrix();
  glm::mat4 proj = getCameraPerspectiveMatrix();
  glm::vec4 viewport = {0., 0., view::bufferWidth, view::bufferHeight};

  glm::vec3 screenPos3{screenCoords.x, view::bufferHeight - screenCoords.y, 0.};
  glm::vec3 worldPos = glm::unProject(screenPos3, view, proj, viewport);
  glm::vec3 worldRayDir = glm::normalize(glm::vec3(worldPos) - getCameraWorldPosition());

  return worldRayDir;
}